

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O1

void anon_unknown.dwarf_31f7105::ProcRand
               (uchar *out,int num,RNGLevel level,bool always_use_real_rng)

{
  long lVar1;
  uint64_t uVar2;
  bool bVar3;
  RNGState *this;
  ulong uVar4;
  Logger *pLVar5;
  int iVar6;
  int iVar7;
  int i;
  int iVar8;
  long in_FS_OFFSET;
  char cVar9;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  uint64_t out_1;
  CSHA512 startup_hasher;
  CSHA512 hasher;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = GetRNGState();
  if (0x20 < num) {
    __assert_fail("num <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/random.cpp"
                  ,0x282,
                  "void (anonymous namespace)::ProcRand(unsigned char *, int, RNGLevel, bool)");
  }
  CSHA512::CSHA512(&hasher);
  if (level == PERIODIC) {
    SeedFast(&hasher);
    SeedTimestamp(&hasher);
    RNGState::SeedEvents(this,&hasher);
    uVar2 = hasher.bytes;
    RandAddDynamicEnv(&hasher);
    pLVar5 = LogInstance();
    bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar5,RAND,Debug);
    if (bVar3) {
      startup_hasher.s[0] = hasher.bytes - uVar2;
      logging_function._M_str = "SeedPeriodic";
      logging_function._M_len = 0xc;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/random.cpp"
      ;
      source_file._M_len = 0x5a;
      LogPrintFormatInternal<unsigned_long>
                (logging_function,source_file,0x25d,RAND,Debug,(ConstevalFormatString<1U>)0x893445,
                 startup_hasher.s);
    }
    SeedStrengthen(&hasher,this,(duration)0x989680);
  }
  else if (level == SLOW) {
    SeedSlow(&hasher,this);
  }
  else {
    SeedFast(&hasher);
  }
  bVar3 = RNGState::MixExtract(this,out,(long)num,&hasher,false,always_use_real_rng);
  if (!bVar3) {
    CSHA512::CSHA512(&startup_hasher);
    if ((anonymous_namespace)::g_rdseed_supported == '\x01') {
      iVar8 = 0;
      do {
        out_1 = rdseed();
        cVar9 = rdseedIsValid();
        while (cVar9 == '\0') {
          out_1 = rdseed();
          cVar9 = rdseedIsValid();
        }
        CSHA512::Write(&startup_hasher,(uchar *)&out_1,8);
        iVar8 = iVar8 + 1;
      } while (iVar8 != 4);
    }
    else if ((anonymous_namespace)::g_rdrand_supported == '\x01') {
      iVar8 = 0;
      do {
        out_1 = 0;
        iVar6 = 0;
        do {
          iVar7 = 9;
          do {
            uVar4 = rdrand();
            cVar9 = rdrandIsValid();
            bVar3 = iVar7 != 0;
            iVar7 = iVar7 + -1;
            if (cVar9 != '\0') break;
          } while (bVar3);
          out_1 = out_1 ^ uVar4;
          iVar6 = iVar6 + 1;
        } while (iVar6 != 0x400);
        CSHA512::Write(&startup_hasher,(uchar *)&out_1,8);
        iVar8 = iVar8 + 1;
      } while (iVar8 != 4);
    }
    SeedSlow(&startup_hasher,this);
    uVar2 = startup_hasher.bytes;
    RandAddDynamicEnv(&startup_hasher);
    RandAddStaticEnv(&startup_hasher);
    pLVar5 = LogInstance();
    bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar5,RAND,Debug);
    if (bVar3) {
      out_1 = startup_hasher.bytes - uVar2;
      logging_function_00._M_str = "SeedStartup";
      logging_function_00._M_len = 0xb;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/random.cpp"
      ;
      source_file_00._M_len = 0x5a;
      LogPrintFormatInternal<unsigned_long>
                (logging_function_00,source_file_00,0x271,RAND,Debug,
                 (ConstevalFormatString<1U>)0x893488,&out_1);
    }
    SeedStrengthen(&startup_hasher,this,(duration)0x5f5e100);
    RNGState::MixExtract(this,out,(long)num,&startup_hasher,true,always_use_real_rng);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ProcRand(unsigned char* out, int num, RNGLevel level, bool always_use_real_rng) noexcept
{
    // Make sure the RNG is initialized first (as all Seed* function possibly need hwrand to be available).
    RNGState& rng = GetRNGState();

    assert(num <= 32);

    CSHA512 hasher;
    switch (level) {
    case RNGLevel::FAST:
        SeedFast(hasher);
        break;
    case RNGLevel::SLOW:
        SeedSlow(hasher, rng);
        break;
    case RNGLevel::PERIODIC:
        SeedPeriodic(hasher, rng);
        break;
    }

    // Combine with and update state
    if (!rng.MixExtract(out, num, std::move(hasher), false, always_use_real_rng)) {
        // On the first invocation, also seed with SeedStartup().
        CSHA512 startup_hasher;
        SeedStartup(startup_hasher, rng);
        rng.MixExtract(out, num, std::move(startup_hasher), true, always_use_real_rng);
    }
}